

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns_constraints.c
# Opt level: O2

int ewt(N_Vector y,N_Vector w,void *user_data)

{
  long lVar1;
  double dVar2;
  double local_18 [3];
  
  local_18[0] = 0.0001;
  local_18[1] = 1e-08;
  local_18[2] = 0.0001;
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 3) {
      return 0;
    }
    dVar2 = ABS(*(double *)(*(long *)((long)y->content + 0x10) + lVar1 * 8)) * 0.0001 +
            local_18[lVar1];
    if (dVar2 <= 0.0) break;
    *(double *)(*(long *)((long)w->content + 0x10) + lVar1 * 8) = 1.0 / dVar2;
    lVar1 = lVar1 + 1;
  }
  return -1;
}

Assistant:

static int ewt(N_Vector y, N_Vector w, void* user_data)
{
  int i;
  sunrealtype yy, ww, rtol, atol[3];

  rtol    = RTOL;
  atol[0] = ATOL1;
  atol[1] = ATOL2;
  atol[2] = ATOL3;

  for (i = 1; i <= 3; i++)
  {
    yy = Ith(y, i);
    ww = rtol * SUNRabs(yy) + atol[i - 1];
    if (ww <= 0.0) { return (-1); }
    Ith(w, i) = 1.0 / ww;
  }

  return (0);
}